

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

bool vkt::SpirVAssembly::compareFloats
               (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                *param_1,
               vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               *outputAllocs,
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *expectedOutputs,TestLog *log)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  BufferInterface *pBVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_reference this;
  Allocation *this_00;
  void *__src;
  undefined4 extraout_var_01;
  MessageBuilder *pMVar7;
  double dVar8;
  MessageBuilder local_1c8;
  float local_48;
  float local_44;
  float actual;
  float expected;
  size_t outputNdx;
  TestLog *pTStack_30;
  float epsilon;
  TestLog *log_local;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  *expectedOutputs_local;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  *outputAllocs_local;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  *param_0_local;
  
  outputNdx._4_4_ = 0x3727c5ac;
  _actual = 0;
  pTStack_30 = log;
  log_local = (TestLog *)expectedOutputs;
  expectedOutputs_local =
       (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
        *)outputAllocs;
  outputAllocs_local =
       (vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_> *)
       param_1;
  while( true ) {
    uVar1 = _actual;
    sVar4 = std::
            vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
            size((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                  *)expectedOutputs_local);
    if (sVar4 <= uVar1) {
      return true;
    }
    pvVar5 = std::
             vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                           *)log_local,_actual);
    pBVar6 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(pvVar5);
    iVar2 = (*pBVar6->_vptr_BufferInterface[3])();
    pvVar5 = std::
             vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                           *)log_local,_actual);
    pBVar6 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(pvVar5);
    iVar3 = (*pBVar6->_vptr_BufferInterface[2])();
    memcpy(&local_44,(void *)CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
    this = std::
           vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
           operator[]((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                       *)expectedOutputs_local,_actual);
    this_00 = de::SharedPtr<vk::Allocation>::operator->(this);
    __src = ::vk::Allocation::getHostPtr(this_00);
    pvVar5 = std::
             vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                           *)log_local,_actual);
    pBVar6 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(pvVar5);
    iVar2 = (*pBVar6->_vptr_BufferInterface[2])();
    memcpy(&local_48,__src,CONCAT44(extraout_var_01,iVar2));
    dVar8 = std::fabs((double)(ulong)(uint)(local_44 - local_48));
    if (1e-05 < SUB84(dVar8,0)) break;
    _actual = _actual + 1;
  }
  tcu::TestLog::operator<<(&local_1c8,pTStack_30,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_1c8,
                      (char (*) [52])"Error: The actual and expected values not matching.");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x1321475);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_44);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])" Actual: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_48);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [11])" Epsilon: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(float *)((long)&outputNdx + 4));
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  return false;
}

Assistant:

bool compareFloats (const std::vector<BufferSp>&, const vector<AllocationSp>& outputAllocs, const std::vector<BufferSp>& expectedOutputs, TestLog& log)
{
	DE_ASSERT(outputAllocs.size() != 0);
	DE_ASSERT(outputAllocs.size() == expectedOutputs.size());

	// Use custom epsilon because of the float->string conversion
	const float	epsilon	= 0.00001f;

	for (size_t outputNdx = 0; outputNdx < outputAllocs.size(); ++outputNdx)
	{
		float expected;
		memcpy(&expected, expectedOutputs[outputNdx]->data(), expectedOutputs[outputNdx]->getNumBytes());

		float actual;
		memcpy(&actual, outputAllocs[outputNdx]->getHostPtr(), expectedOutputs[outputNdx]->getNumBytes());

		// Test with epsilon
		if (fabs(expected - actual) > epsilon)
		{
			log << TestLog::Message << "Error: The actual and expected values not matching."
				<< " Expected: " << expected << " Actual: " << actual << " Epsilon: " << epsilon << TestLog::EndMessage;
			return false;
		}
	}
	return true;
}